

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O0

DUH * dumb_read_riff_amff(DUMBFILE *f,riff *stream)

{
  DUMB_IT_SIGDATA *tags;
  undefined8 in_RSI;
  char *tag [2] [2];
  DUH_SIGTYPE_DESC *descptr;
  long length;
  sigdata_t *sigdata;
  sigdata_t **in_stack_ffffffffffffffc8;
  DUH_SIGTYPE_DESC *desc;
  DUH *local_8;
  
  desc = &_dumb_sigtype_it;
  tags = it_riff_amff_load_sigdata((DUMBFILE *)tag[0][1],(riff *)tag[0][0]);
  if (tags == (DUMB_IT_SIGDATA *)0x0) {
    local_8 = (DUH *)0x0;
  }
  else {
    local_8 = make_duh((int32)((ulong)in_RSI >> 0x20),(int)in_RSI,(char *(*) [2])tags,0,
                       (DUH_SIGTYPE_DESC **)desc,in_stack_ffffffffffffffc8);
  }
  return local_8;
}

Assistant:

DUH *dumb_read_riff_amff( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;
	long length;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_amff_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	length = 0;/*_dumb_it_build_checkpoints(sigdata, 0);*/

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF AMFF";
		return make_duh( length, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}